

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

shared_ptr<kratos::SwitchStmt> __thiscall
kratos::RemoveEmptyBlockVisitor::process
          (RemoveEmptyBlockVisitor *this,shared_ptr<kratos::SwitchStmt> *stmt)

{
  bool bVar1;
  element_type *peVar2;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *this_00;
  reference __in;
  type *__args;
  __shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::SwitchStmt> sVar3;
  undefined1 local_c8 [32];
  undefined1 local_a8 [8];
  shared_ptr<kratos::StmtBlock> r;
  type *block;
  type *cond;
  _Self local_80;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range2;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *body;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  new_body;
  shared_ptr<kratos::SwitchStmt> *stmt_local;
  RemoveEmptyBlockVisitor *this_local;
  
  std::
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  ::map((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
         *)&body);
  peVar2 = std::__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  this_00 = SwitchStmt::body(peVar2);
  __end2 = std::
           map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
           ::begin(this_00);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
       ::end(this_00);
  while (bVar1 = std::operator!=(&__end2,&local_80), bVar1) {
    __in = std::
           _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
           ::operator*(&__end2);
    __args = std::
             get<0ul,std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>
                       (__in);
    r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::get<1ul,std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>
                   (__in);
    std::shared_ptr<kratos::StmtBlock>::shared_ptr<kratos::ScopedStmtBlock,void>
              ((shared_ptr<kratos::StmtBlock> *)(local_c8 + 0x10),
               (shared_ptr<kratos::ScopedStmtBlock> *)
               r.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
    process((RemoveEmptyBlockVisitor *)local_a8,(shared_ptr<kratos::StmtBlock> *)stmt);
    std::shared_ptr<kratos::StmtBlock>::~shared_ptr
              ((shared_ptr<kratos::StmtBlock> *)(local_c8 + 0x10));
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a8);
    if (bVar1) {
      std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )local_a8);
      Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_c8);
      std::
      map<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::ScopedStmtBlock>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>
      ::emplace<std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::ScopedStmtBlock>>
                ((map<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::ScopedStmtBlock>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>
                  *)&body,__args,(shared_ptr<kratos::ScopedStmtBlock> *)local_c8);
      std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)local_c8);
    }
    std::shared_ptr<kratos::StmtBlock>::~shared_ptr((shared_ptr<kratos::StmtBlock> *)local_a8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::
          map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
          ::empty((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                   *)&body);
  if (bVar1) {
    std::shared_ptr<kratos::SwitchStmt>::shared_ptr
              ((shared_ptr<kratos::SwitchStmt> *)this,(nullptr_t)0x0);
  }
  else {
    peVar2 = std::__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(in_RDX);
    SwitchStmt::set_body
              (peVar2,(map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                       *)&body);
    std::shared_ptr<kratos::SwitchStmt>::shared_ptr
              ((shared_ptr<kratos::SwitchStmt> *)this,(shared_ptr<kratos::SwitchStmt> *)in_RDX);
  }
  std::
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  ::~map((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
          *)&body);
  sVar3.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::SwitchStmt>)
         sVar3.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SwitchStmt> process(std::shared_ptr<SwitchStmt> stmt) {
        std::map<std::shared_ptr<Const>, std::shared_ptr<ScopedStmtBlock>> new_body;
        auto const& body = stmt->body();
        for (const auto& [cond, block] : body) {
            auto r = process(block);
            if (r) {
                new_body.emplace(cond, r->as<ScopedStmtBlock>());
            }
        }
        if (new_body.empty()) return nullptr;
        stmt->set_body(new_body);
        return stmt;
    }